

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_sse4.c
# Opt level: O2

void av1_get_horver_correlation_full_sse4_1
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  short *psVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  short *psVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long *plVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  float fVar25;
  long lVar26;
  long lVar27;
  float fVar28;
  long lVar29;
  long lVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  int iVar38;
  undefined1 auVar37 [16];
  float fVar39;
  int iVar41;
  int iVar42;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  lVar18 = (long)stride;
  lVar29 = 0;
  lVar30 = 0;
  lVar26 = 0;
  lVar27 = 0;
  plVar19 = (long *)diff;
  for (lVar20 = 0; lVar20 <= height + -4; lVar20 = lVar20 + 3) {
    lVar16 = 0;
    auVar40 = (undefined1  [16])0x0;
    auVar36 = (undefined1  [16])0x0;
    plVar6 = plVar19;
    auVar50 = (undefined1  [16])0x0;
    auVar47 = (undefined1  [16])0x0;
    while( true ) {
      auVar37._0_4_ = auVar36._0_4_;
      iVar5 = auVar47._12_4_;
      iVar41 = auVar40._4_4_;
      iVar15 = auVar36._4_4_;
      iVar38 = auVar36._12_4_;
      iVar10 = auVar50._12_4_;
      iVar13 = auVar36._8_4_;
      iVar42 = auVar40._8_4_;
      if (width + -4 < lVar16) break;
      lVar12 = *(long *)((long)plVar6 + (long)(stride * 2) * 2);
      auVar49._8_8_ = *plVar6;
      auVar49._0_8_ = lVar12;
      lVar23 = *(long *)((long)plVar6 + lVar18 * 2);
      lVar9 = *(long *)((long)plVar6 + (long)(stride * 3) * 2);
      auVar52._8_8_ = lVar23;
      auVar52._0_8_ = lVar9;
      auVar43._0_8_ = lVar12 << 0x10;
      auVar43._8_8_ = *plVar6 << 0x10;
      auVar45._0_8_ = lVar9 << 0x10;
      auVar45._8_8_ = lVar23 << 0x10;
      auVar36 = pmaddwd(auVar49,auVar43);
      auVar53 = pmaddwd(auVar52,auVar45);
      auVar36 = phaddd(auVar53,auVar36);
      auVar32._0_4_ = auVar50._0_4_ + auVar36._0_4_;
      auVar32._4_4_ = auVar50._4_4_ + auVar36._4_4_;
      auVar32._8_4_ = auVar50._8_4_ + auVar36._8_4_;
      auVar32._12_4_ = iVar10 + auVar36._12_4_;
      auVar50 = pmaddwd(auVar43,auVar45);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = auVar45._8_8_;
      auVar36 = pmaddwd(auVar43,auVar46);
      auVar53 = phaddd(auVar36,auVar50);
      auVar34._0_4_ = auVar47._0_4_ + auVar53._0_4_;
      auVar34._4_4_ = auVar47._4_4_ + auVar53._4_4_;
      auVar34._8_4_ = auVar47._8_4_ + auVar53._8_4_;
      auVar34._12_4_ = iVar5 + auVar53._12_4_;
      auVar50 = phaddw(auVar43,auVar43);
      auVar36 = pmovsxwd(auVar50,auVar50);
      auVar53 = pmovsxwd(auVar53,auVar46);
      iVar10 = auVar40._12_4_;
      auVar50 = pmaddwd(auVar43,auVar43);
      auVar47 = pmaddwd(auVar46,auVar46);
      auVar50 = phaddd(auVar50,auVar47);
      auVar40._0_4_ = auVar40._0_4_ + auVar53._0_4_ + auVar36._0_4_;
      auVar40._4_4_ = iVar41 + auVar53._4_4_ + auVar36._4_4_;
      auVar40._8_4_ = iVar42 + auVar53._8_4_ + auVar36._8_4_;
      auVar40._12_4_ = iVar10 + auVar53._12_4_ + auVar36._12_4_;
      auVar36._0_4_ = auVar37._0_4_ + auVar50._0_4_;
      auVar36._4_4_ = iVar15 + auVar50._4_4_;
      auVar36._8_4_ = iVar13 + auVar50._8_4_;
      auVar36._12_4_ = iVar38 + auVar50._12_4_;
      lVar16 = lVar16 + 3;
      plVar6 = (long *)((long)plVar6 + 6);
      auVar50 = auVar32;
      auVar47 = auVar34;
    }
    auVar44._0_8_ = auVar36._8_8_;
    auVar44._8_4_ = iVar13;
    auVar44._12_4_ = iVar38;
    auVar53 = pblendw(auVar44,auVar40,0xc);
    auVar48._4_4_ = auVar50._8_4_;
    auVar48._0_4_ = auVar47._8_4_;
    auVar48._8_4_ = iVar5;
    auVar48._12_4_ = iVar10;
    auVar51._4_4_ = iVar10;
    auVar51._0_4_ = iVar5;
    auVar51._8_4_ = iVar5;
    auVar51._12_4_ = iVar10;
    auVar51 = pmovsxdq(auVar51,auVar51);
    auVar44 = pmovsxdq(auVar53,auVar53);
    auVar53 = pblendw(auVar36,auVar40,0xf0);
    auVar54._8_4_ = auVar53._8_4_;
    auVar54._12_4_ = auVar53._12_4_;
    auVar54._4_4_ = auVar54._12_4_;
    auVar54._0_4_ = auVar53._4_4_;
    auVar48 = pmovsxdq(auVar48,auVar48);
    auVar54 = pmovsxdq(auVar54,auVar54);
    auVar53._0_8_ = auVar36._0_8_;
    auVar53._8_4_ = iVar15;
    auVar53._12_4_ = iVar41;
    auVar37._8_8_ = auVar53._8_8_;
    auVar37._4_4_ = auVar40._0_4_;
    auVar47 = pblendw(auVar47,auVar50,0xc);
    auVar50 = pmovsxdq(auVar50,auVar37);
    auVar47 = pmovsxdq(auVar47,auVar47);
    lVar29 = lVar29 + auVar50._0_8_ + auVar54._0_8_ + auVar44._0_8_;
    lVar30 = lVar30 + iVar42 + auVar50._8_8_ + auVar54._8_8_ + auVar44._8_8_;
    lVar26 = lVar26 + auVar48._0_8_ + auVar51._0_8_ + auVar47._0_8_;
    lVar27 = lVar27 + auVar48._8_8_ + auVar51._8_8_ + auVar47._8_8_;
    plVar19 = (long *)((long)plVar19 + lVar18 * 6);
  }
  iVar10 = height % 3;
  if (iVar10 == 1) {
    psVar7 = diff + (height + -1) * stride;
    iVar5 = (int)*psVar7;
    lVar20 = (long)iVar5;
    lVar30 = lVar30 + lVar20;
    uVar21 = (ulong)(uint)(iVar5 * iVar5);
    lVar29 = lVar29 + uVar21;
    iVar5 = 1;
    if (1 < width) {
      iVar5 = width;
    }
    for (uVar11 = 0; iVar5 - 1 != uVar11; uVar11 = uVar11 + 1) {
      sVar2 = psVar7[uVar11 + 1];
      lVar16 = (long)sVar2;
      lVar27 = lVar27 + psVar7[uVar11] * lVar16;
      lVar30 = lVar30 + lVar16;
      lVar20 = lVar20 + lVar16;
      uVar22 = (ulong)(uint)((int)sVar2 * (int)sVar2);
      lVar29 = lVar29 + uVar22;
      uVar21 = uVar21 + uVar22;
    }
  }
  else {
    psVar7 = diff + (height + -2) * stride;
    iVar5 = (int)*psVar7;
    psVar1 = diff + (height + -1) * stride;
    sVar2 = *psVar1;
    lVar20 = (long)sVar2;
    lVar30 = lVar30 + (sVar2 + iVar5);
    uVar4 = (int)sVar2 * (int)sVar2;
    uVar21 = (ulong)uVar4;
    lVar29 = lVar29 + (ulong)(iVar5 * iVar5 + uVar4);
    iVar5 = 1;
    if (1 < width) {
      iVar5 = width;
    }
    for (uVar11 = 0; iVar5 - 1 != uVar11; uVar11 = uVar11 + 1) {
      iVar15 = (int)psVar7[uVar11 + 1];
      sVar2 = psVar1[uVar11 + 1];
      lVar26 = lVar26 + (int)psVar7[uVar11] * (int)psVar1[uVar11];
      lVar27 = lVar27 + iVar15 * psVar7[uVar11] + (long)((int)psVar1[uVar11] * (int)sVar2);
      lVar30 = lVar30 + (sVar2 + iVar15);
      lVar20 = lVar20 + sVar2;
      uVar4 = (int)sVar2 * (int)sVar2;
      lVar29 = lVar29 + (ulong)(iVar15 * iVar15 + uVar4);
      uVar21 = uVar21 + uVar4;
    }
  }
  if (width % 3 == 1) {
    psVar7 = diff + (long)width + -1;
    iVar5 = (int)*psVar7;
    lVar16 = (long)iVar5;
    lVar30 = lVar30 + lVar16;
    uVar11 = (ulong)(uint)(iVar5 * iVar5);
    lVar29 = lVar29 + uVar11;
    iVar5 = 1;
    if (1 < height) {
      iVar5 = height;
    }
    for (uVar22 = 0; iVar5 - 1 != uVar22; uVar22 = uVar22 + 1) {
      sVar2 = *psVar7;
      sVar3 = psVar7[lVar18];
      uVar14 = (ulong)sVar3;
      psVar7 = psVar7 + lVar18;
      lVar26 = lVar26 + (long)sVar2 * uVar14;
      lVar16 = lVar16 + uVar14;
      uVar8 = (ulong)(uint)((int)sVar3 * (int)sVar3);
      uVar11 = uVar11 + uVar8;
      if ((long)(int)((uint)(iVar10 == 1) + height + -3) <= (long)uVar22) {
        uVar14 = 0;
        uVar8 = 0;
      }
      lVar29 = lVar29 + uVar8;
      lVar30 = lVar30 + uVar14;
    }
  }
  else {
    psVar7 = diff + (long)width + -1;
    iVar5 = (int)psVar7[-1];
    sVar2 = *psVar7;
    lVar16 = (long)sVar2;
    lVar30 = lVar30 + (sVar2 + iVar5);
    uVar4 = (int)sVar2 * (int)sVar2;
    uVar11 = (ulong)uVar4;
    lVar29 = lVar29 + (ulong)(iVar5 * iVar5 + uVar4);
    iVar5 = 1;
    if (1 < height) {
      iVar5 = height;
    }
    for (uVar22 = 0; iVar5 - 1 != uVar22; uVar22 = uVar22 + 1) {
      iVar15 = (int)psVar7[lVar18 + -1];
      if ((iVar10 == 1) || ((long)uVar22 < (long)(height + -2))) {
        lVar27 = lVar27 + (int)psVar7[-1] * (int)*psVar7;
        lVar26 = lVar26 + psVar7[-1] * iVar15;
      }
      sVar2 = psVar7[lVar18];
      iVar13 = (int)sVar2;
      if ((long)uVar22 < (long)(int)((uint)(iVar10 == 1) + height + -3)) {
        lVar30 = lVar30 + (iVar15 + sVar2);
        lVar29 = lVar29 + (ulong)(uint)(iVar15 * iVar15 + iVar13 * iVar13);
      }
      lVar16 = lVar16 + sVar2;
      uVar11 = uVar11 + (uint)(iVar13 * iVar13);
      lVar26 = lVar26 + *psVar7 * iVar13;
      psVar7 = psVar7 + lVar18;
    }
  }
  uVar8 = 0;
  uVar22 = 0;
  if (0 < width) {
    uVar22 = (ulong)(uint)width;
  }
  lVar12 = 0;
  lVar23 = 0;
  for (; uVar22 != uVar8; uVar8 = uVar8 + 1) {
    iVar10 = (int)diff[uVar8];
    lVar23 = lVar23 + iVar10;
    lVar12 = lVar12 + (ulong)(uint)(iVar10 * iVar10);
  }
  lVar9 = 0;
  uVar22 = 0;
  if (0 < height) {
    uVar22 = (ulong)(uint)height;
  }
  lVar17 = 0;
  while (bVar24 = uVar22 != 0, uVar22 = uVar22 - 1, bVar24) {
    iVar10 = (int)*diff;
    lVar9 = lVar9 + iVar10;
    lVar17 = lVar17 + (ulong)(uint)(iVar10 * iVar10);
    diff = diff + lVar18;
  }
  lVar16 = lVar30 - lVar16;
  fVar28 = (float)((width + -1) * height);
  lVar20 = lVar30 - lVar20;
  fVar35 = (float)((height + -1) * width);
  fVar25 = (float)(long)(lVar29 - uVar11) - (float)(lVar16 * lVar16) / fVar28;
  fVar39 = (float)(long)(lVar29 - uVar21) - (float)(lVar20 * lVar20) / fVar35;
  fVar33 = 1.0;
  if (0.0 < fVar25) {
    lVar9 = lVar30 - lVar9;
    fVar31 = (float)(lVar29 - lVar17) - (float)(lVar9 * lVar9) / fVar28;
    fVar33 = 1.0;
    if (0.0 < fVar31) {
      fVar25 = fVar25 * fVar31;
      if (fVar25 < 0.0) {
        fVar25 = sqrtf(fVar25);
      }
      else {
        fVar25 = SQRT(fVar25);
      }
      fVar25 = ((float)lVar27 - (float)(lVar9 * lVar16) / fVar28) / fVar25;
      fVar33 = 0.0;
      if (0.0 <= fVar25) {
        fVar33 = fVar25;
      }
    }
  }
  *hcorr = fVar33;
  fVar33 = 1.0;
  if (0.0 < fVar39) {
    lVar30 = lVar30 - lVar23;
    fVar25 = (float)(lVar29 - lVar12) - (float)(lVar30 * lVar30) / fVar35;
    if (0.0 < fVar25) {
      fVar39 = fVar39 * fVar25;
      if (fVar39 < 0.0) {
        fVar39 = sqrtf(fVar39);
      }
      else {
        fVar39 = SQRT(fVar39);
      }
      fVar39 = ((float)lVar26 - (float)(lVar30 * lVar20) / fVar35) / fVar39;
      fVar33 = 0.0;
      if (0.0 <= fVar39) {
        fVar33 = fVar39;
      }
    }
  }
  *vcorr = fVar33;
  return;
}

Assistant:

void av1_get_horver_correlation_full_sse4_1(const int16_t *diff, int stride,
                                            int width, int height, float *hcorr,
                                            float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - right neighbour pixel
  // z - below neighbour pixel
  // w - down-right neighbour pixel
  int64_t xy_sum = 0, xz_sum = 0;
  int64_t x_sum = 0, x2_sum = 0;

  // Process horizontal and vertical correlations through the body in 4x4
  // blocks.  This excludes the final row and column and possibly one extra
  // column depending how 3 divides into width and height
  int32_t xy_tmp[4] = { 0 }, xz_tmp[4] = { 0 };
  int32_t x_tmp[4] = { 0 }, x2_tmp[4] = { 0 };
  __m128i xy_sum_32 = _mm_setzero_si128();
  __m128i xz_sum_32 = _mm_setzero_si128();
  __m128i x_sum_32 = _mm_setzero_si128();
  __m128i x2_sum_32 = _mm_setzero_si128();
  for (int i = 0; i <= height - 4; i += 3) {
    for (int j = 0; j <= width - 4; j += 3) {
      horver_correlation_4x4(&diff[i * stride + j], stride, &xy_sum_32,
                             &xz_sum_32, &x_sum_32, &x2_sum_32);
    }
    xx_storeu_128(xy_tmp, xy_sum_32);
    xx_storeu_128(xz_tmp, xz_sum_32);
    xx_storeu_128(x_tmp, x_sum_32);
    xx_storeu_128(x2_tmp, x2_sum_32);
    xy_sum += (int64_t)xy_tmp[3] + xy_tmp[2] + xy_tmp[1];
    xz_sum += (int64_t)xz_tmp[3] + xz_tmp[2] + xz_tmp[0];
    x_sum += (int64_t)x_tmp[3] + x_tmp[2] + x_tmp[1] + x_tmp[0];
    x2_sum += (int64_t)x2_tmp[2] + x2_tmp[1] + x2_tmp[0];
    xy_sum_32 = _mm_setzero_si128();
    xz_sum_32 = _mm_setzero_si128();
    x_sum_32 = _mm_setzero_si128();
    x2_sum_32 = _mm_setzero_si128();
  }

  // x_sum now covers every pixel except the final 1-2 rows and 1-2 cols
  int64_t x_finalrow = 0, x_finalcol = 0, x2_finalrow = 0, x2_finalcol = 0;

  // Do we have 2 rows remaining or just the one?  Note that width and height
  // are powers of 2, so each modulo 3 must be 1 or 2.
  if (height % 3 == 1) {  // Just horiz corrs on the final row
    const int16_t x0 = diff[(height - 1) * stride];
    x_sum += x0;
    x_finalrow += x0;
    x2_sum += x0 * x0;
    x2_finalrow += x0 * x0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 1) * stride + j];
      const int16_t y = diff[(height - 1) * stride + j + 1];
      xy_sum += x * y;
      x_sum += y;
      x2_sum += y * y;
      x_finalrow += y;
      x2_finalrow += y * y;
    }
  } else {  // Two rows remaining to do
    const int16_t x0 = diff[(height - 2) * stride];
    const int16_t z0 = diff[(height - 1) * stride];
    x_sum += x0 + z0;
    x2_sum += x0 * x0 + z0 * z0;
    x_finalrow += z0;
    x2_finalrow += z0 * z0;
    for (int j = 0; j < width - 1; ++j) {
      const int16_t x = diff[(height - 2) * stride + j];
      const int16_t y = diff[(height - 2) * stride + j + 1];
      const int16_t z = diff[(height - 1) * stride + j];
      const int16_t w = diff[(height - 1) * stride + j + 1];

      // Horizontal and vertical correlations for the penultimate row:
      xy_sum += x * y;
      xz_sum += x * z;

      // Now just horizontal correlations for the final row:
      xy_sum += z * w;

      x_sum += y + w;
      x2_sum += y * y + w * w;
      x_finalrow += w;
      x2_finalrow += w * w;
    }
  }

  // Do we have 2 columns remaining or just the one?
  if (width % 3 == 1) {  // Just vert corrs on the final col
    const int16_t x0 = diff[width - 1];
    x_sum += x0;
    x_finalcol += x0;
    x2_sum += x0 * x0;
    x2_finalcol += x0 * x0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 1];
      xz_sum += x * z;
      x_finalcol += z;
      x2_finalcol += z * z;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z;
        x2_sum += z * z;
      }
    }
  } else {  // Two cols remaining
    const int16_t x0 = diff[width - 2];
    const int16_t y0 = diff[width - 1];
    x_sum += x0 + y0;
    x2_sum += x0 * x0 + y0 * y0;
    x_finalcol += y0;
    x2_finalcol += y0 * y0;
    for (int i = 0; i < height - 1; ++i) {
      const int16_t x = diff[i * stride + width - 2];
      const int16_t y = diff[i * stride + width - 1];
      const int16_t z = diff[(i + 1) * stride + width - 2];
      const int16_t w = diff[(i + 1) * stride + width - 1];

      // Horizontal and vertical correlations for the penultimate col:
      // Skip these on the last iteration of this loop if we also had two
      // rows remaining, otherwise the final horizontal and vertical correlation
      // get erroneously processed twice
      if (i < height - 2 || height % 3 == 1) {
        xy_sum += x * y;
        xz_sum += x * z;
      }

      x_finalcol += w;
      x2_finalcol += w * w;
      // So the bottom-right elements don't get counted twice:
      if (i < height - (height % 3 == 1 ? 2 : 3)) {
        x_sum += z + w;
        x2_sum += z * z + w * w;
      }

      // Now just vertical correlations for the final column:
      xz_sum += y * w;
    }
  }

  // Calculate the simple sums and squared-sums
  int64_t x_firstrow = 0, x_firstcol = 0;
  int64_t x2_firstrow = 0, x2_firstcol = 0;

  for (int j = 0; j < width; ++j) {
    x_firstrow += diff[j];
    x2_firstrow += diff[j] * diff[j];
  }
  for (int i = 0; i < height; ++i) {
    x_firstcol += diff[i * stride];
    x2_firstcol += diff[i * stride] * diff[i * stride];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}